

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DestroyPlatformWindows(void)

{
  ImGuiContext_conflict *pIVar1;
  ImGuiViewportP **ppIVar2;
  int local_14;
  int i;
  ImGuiContext_conflict *g;
  
  pIVar1 = GImGui;
  for (local_14 = 0; local_14 < (pIVar1->Viewports).Size; local_14 = local_14 + 1) {
    ppIVar2 = ImVector<ImGuiViewportP_*>::operator[](&pIVar1->Viewports,local_14);
    DestroyPlatformWindow(*ppIVar2);
  }
  return;
}

Assistant:

void ImGui::DestroyPlatformWindows()
{
    // We call the destroy window on every viewport (including the main viewport, index 0) to give a chance to the backend
    // to clear any data they may have stored in e.g. PlatformUserData, RendererUserData.
    // It is convenient for the platform backend code to store something in the main viewport, in order for e.g. the mouse handling
    // code to operator a consistent manner.
    // It is expected that the backend can handle calls to Renderer_DestroyWindow/Platform_DestroyWindow without
    // crashing if it doesn't have data stored.
    ImGuiContext& g = *GImGui;
    for (int i = 0; i < g.Viewports.Size; i++)
        DestroyPlatformWindow(g.Viewports[i]);
}